

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O2

void __thiscall wasm::Fuzzer::checkCanonicalization(Fuzzer *this)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  pointer *this_00;
  pointer *ppFVar1;
  pointer pHVar2;
  uint *puVar3;
  Field *pFVar4;
  bool open;
  Shareability share;
  Index end;
  undefined4 uVar5;
  mapped_type *this_01;
  _Storage<wasm::HeapType,_true> _Var6;
  size_type __n;
  pointer pFVar7;
  Type TVar8;
  Type TVar9;
  long *plVar10;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  ostream *poVar11;
  Fatal *pFVar12;
  Type old;
  uint *puVar13;
  long lVar14;
  char *pcVar15;
  size_t i;
  ulong uVar16;
  pointer pFVar17;
  byte bVar18;
  uint uVar19;
  Field *field;
  long lVar20;
  Field *pFVar21;
  optional<wasm::HeapType> other;
  Signature signature;
  undefined1 auVar22 [16];
  Printed in_stack_fffffffffffffc58;
  undefined1 local_380 [8];
  anon_class_24_3_e2d675ed finishGroup;
  undefined1 auStack_2e8 [8];
  FieldList fields;
  Field local_158;
  _Variadic_union<Copier::NewType,_Copier::OldType> local_130;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_128;
  pointer *local_120;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_118;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  uint local_c8;
  long local_c0;
  size_t currGroupStart;
  _Any_data a_Stack_b0 [2];
  undefined1 local_88 [8];
  BuildResult result;
  value_type type;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newTypes;
  TypeBuilder builder;
  
  types = &this->types;
  this_00 = &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  wasm::TypeBuilder::TypeBuilder
            ((TypeBuilder *)this_00,
             (long)(this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_130 = (_Variadic_union<Copier::NewType,_Copier::OldType>)&this->rand;
  local_118._M_buckets = &local_118._M_single_bucket;
  local_118._M_bucket_count = 1;
  local_118._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_118._M_element_count = 0;
  local_118._M_rehash_policy._M_max_load_factor = 1.0;
  local_118._M_rehash_policy._M_next_resize = 0;
  local_118._M_single_bucket = (__node_base_ptr)0x0;
  local_e0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_e0._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_e0._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_e0._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_c8 = 0;
  lVar20 = 0;
  local_128 = types;
  local_120 = this_00;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ = this;
  for (uVar16 = 0;
      pHVar2 = (local_128->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(local_128->
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pHVar2 >> 3);
      uVar16 = uVar16 + 1) {
    this_01 = std::__detail::
              _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&local_118,(key_type *)((long)&pHVar2->id + lVar20));
    auStack_2e8._0_4_ = (int)uVar16;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (this_01,(uint *)auStack_2e8);
    lVar20 = lVar20 + 8;
  }
  for (pFVar17 = (pointer)0x0;
      lVar20 = *(long *)(result.
                         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         ._24_8_ + 0x20),
      pFVar17 < (pointer)((*(long *)(result.
                                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                     .
                                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                     .
                                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                     ._24_8_ + 0x28) - lVar20) / 0x18);
      pFVar17 = (pointer)((long)&(pFVar17->type).id + 1)) {
    puVar3 = *(uint **)(lVar20 + 8 + (long)pFVar17 * 0x18);
    for (puVar13 = *(uint **)(lVar20 + (long)pFVar17 * 0x18); puVar13 != puVar3;
        puVar13 = puVar13 + 1) {
      if (pFVar17 != (pointer)(ulong)*puVar13) {
        local_380 = (undefined1  [8])
                    &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
        finishGroup.builder = (TypeBuilder *)pFVar17;
        auStack_2e8 = local_380;
        fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(ulong)*puVar13;
        _Var6._M_value = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)local_380);
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)_Var6;
        TypeBuilder::Entry::subTypeOf((Entry *)auStack_2e8,other);
      }
    }
  }
  for (pFVar17 = (pointer)0x0;
      pFVar17 < (pointer)((long)(local_128->
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_128->
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
      pFVar17 = (pointer)((long)&(pFVar17->type).id + 1)) {
    auStack_2e8 = (undefined1  [8])
                  &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = pFVar17;
    open = (bool)wasm::HeapType::isOpen();
    TypeBuilder::Entry::setOpen((Entry *)auStack_2e8,open);
    auStack_2e8 = (undefined1  [8])
                  &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = pFVar17;
    share = wasm::HeapType::getShared();
    TypeBuilder::Entry::setShared((Entry *)auStack_2e8,share);
  }
  __n = wasm::TypeBuilder::size();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e0,__n);
  finishGroup.builder = (TypeBuilder *)&local_c0;
  local_c0 = 0;
  finishGroup.currGroupStart = (size_t *)&local_130;
  bVar18 = 0;
  local_380 = (undefined1  [8])
              &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  for (uVar19 = 0;
      (ulong)uVar19 <
      (ulong)((long)(local_128->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_128->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 3); uVar19 = uVar19 + 1) {
    pFVar7 = (pointer)wasm::HeapType::getRecGroup();
    if ((!(bool)(bVar18 & pFVar7 == pFVar17)) ||
       (pHVar2 = (local_128->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start, pHVar2[uVar19].id == pHVar2[local_c0].id)
       ) {
      checkCanonicalization::Copier::Copier::anon_class_24_3_e2d675ed::operator()
                ((anon_class_24_3_e2d675ed *)local_380,uVar19);
      pFVar17 = pFVar7;
    }
    bVar18 = 1;
  }
  end = wasm::TypeBuilder::size();
  checkCanonicalization::Copier::Copier::anon_class_24_3_e2d675ed::operator()
            ((anon_class_24_3_e2d675ed *)local_380,end);
  do {
    if ((ulong)((long)(local_128->
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_128->
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)local_c8) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_e0);
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_118);
      wasm::TypeBuilder::build();
      if (result.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _M_first._M_storage._M_storage[0x10] == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_2e8,"",(allocator<char> *)&currGroupStart);
        IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
        IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                  ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_380,types,
                   (string *)auStack_2e8);
        std::__cxx11::string::~string((string *)auStack_2e8);
        Fatal::Fatal((Fatal *)auStack_2e8);
        std::operator<<((ostream *)
                        &fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                         _M_impl.super__Vector_impl_data._M_finish,
                        "Failed to build copies of the types: ");
        pFVar12 = Fatal::operator<<((Fatal *)auStack_2e8,(ErrorReason *)&result);
        std::operator<<((ostream *)&pFVar12->field_0x10," at index ");
        Fatal::operator<<(pFVar12,(unsigned_long *)local_88);
      }
      else {
        __x = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)local_88);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&type,__x);
        lVar20 = *(long *)(result.
                           super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           ._24_8_ + 0x10) -
                 *(long *)(result.
                           super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           .
                           super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                           ._24_8_ + 8);
        if (lVar20 != (long)newTypes.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start - type.id) {
          __assert_fail("types.size() == newTypes.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp"
                        ,0x1d2,"void wasm::Fuzzer::checkCanonicalization()");
        }
        lVar14 = 0;
        while( true ) {
          if (lVar20 >> 3 == lVar14) {
            std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                      ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&type);
            std::__detail::__variant::
            _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                 *)local_88);
            wasm::TypeBuilder::~TypeBuilder
                      ((TypeBuilder *)
                       &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            return;
          }
          if (*(long *)(*(long *)(result.
                                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  ._24_8_ + 8) + lVar14 * 8) != *(long *)(type.id + lVar14 * 8))
          break;
          lVar14 = lVar14 + 1;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_2e8,"",(allocator<char> *)&currGroupStart);
        IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
        IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                  ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_380,types,
                   (string *)auStack_2e8);
        std::__cxx11::string::~string((string *)auStack_2e8);
        std::operator<<((ostream *)&std::cerr,"\n");
        uVar16 = 0;
        while( true ) {
          if ((ulong)((long)((long)newTypes.
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_start - type.id) >> 3) <=
              uVar16) break;
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          poVar11 = std::operator<<(poVar11,": ");
          TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
          operator()((Printed *)&stack0xfffffffffffffc58,
                     (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                      *)local_380,(HeapType)*(uintptr_t *)(type.id + uVar16 * 8));
          poVar11 = (ostream *)wasm::operator<<(poVar11,in_stack_fffffffffffffc58);
          std::operator<<(poVar11,"\n");
          std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffc60);
          uVar16 = uVar16 + 1;
        }
        Fatal::Fatal((Fatal *)auStack_2e8);
        ppFVar1 = &fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        std::operator<<((ostream *)ppFVar1,"Copy of type at index ");
        std::ostream::_M_insert<unsigned_long>((ulong)ppFVar1);
        std::operator<<((ostream *)ppFVar1," is distinct:\n");
        std::operator<<((ostream *)ppFVar1,"original: ");
        TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
        operator()((Printed *)&currGroupStart,
                   (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                    *)local_380,
                   (HeapType)
                   (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar14].id);
        pFVar12 = Fatal::operator<<((Fatal *)auStack_2e8,(Printed *)&currGroupStart);
        std::operator<<((ostream *)&pFVar12->field_0x10,'\n');
        std::operator<<((ostream *)&pFVar12->field_0x10,"copy:     ");
        TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
        operator()((Printed *)&local_158,
                   (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                    *)local_380,(HeapType)*(uintptr_t *)(type.id + lVar14 * 8));
        Fatal::operator<<(pFVar12,(Printed *)&local_158);
        HeapType::Printed::~Printed((Printed *)&local_158);
        HeapType::Printed::~Printed((Printed *)&currGroupStart);
      }
      Fatal::~Fatal((Fatal *)auStack_2e8);
    }
    uVar5 = wasm::HeapType::getKind();
    switch(uVar5) {
    case 1:
      auVar22 = wasm::HeapType::getSignature();
      TVar8.id = (uintptr_t)
                 checkCanonicalization()::Copier::getType(wasm::Type_
                           ((CopiedType *)&local_130._M_first,auVar22._0_8_,auVar22._8_8_);
      TVar9.id = (uintptr_t)
                 checkCanonicalization()::Copier::getType(wasm::Type_
                           ((CopiedType *)&local_130._M_first,auVar22._8_8_,old);
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(ulong)local_c8;
      auStack_2e8 = (undefined1  [8])
                    &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      signature.results.id = TVar9.id;
      signature.params.id = TVar8.id;
      TypeBuilder::Entry::operator=((Entry *)auStack_2e8,signature);
      break;
    case 2:
      plVar10 = (long *)wasm::HeapType::getStruct();
      auStack_2e8 = (undefined1  [8])0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2e8,
                 plVar10[1] - *plVar10 >> 4);
      pFVar4 = (Field *)plVar10[1];
      for (pFVar21 = (Field *)*plVar10; pFVar21 != pFVar4; pFVar21 = pFVar21 + 1) {
        local_158 = checkCanonicalization()::Copier::getField(wasm::Field_(&local_130,*pFVar21);
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::emplace_back<wasm::Field>
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2e8,&local_158);
      }
      currGroupStart = (size_t)auStack_2e8;
      a_Stack_b0[0]._M_unused._M_object =
           fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
      a_Stack_b0[0]._8_8_ =
           fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
      auStack_2e8 = (undefined1  [8])0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2e8);
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(ulong)local_c8;
      auStack_2e8 = (undefined1  [8])
                    &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      TypeBuilder::Entry::operator=((Entry *)auStack_2e8,(Struct *)&currGroupStart);
      std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&currGroupStart);
      break;
    case 3:
      wasm::HeapType::getArray();
      _type = checkCanonicalization()::Copier::getField(wasm::Field_(&local_130,_type);
      local_88 = (undefined1  [8])type.id;
      result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
           = newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start;
      fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(ulong)local_c8;
      auStack_2e8 = (undefined1  [8])
                    &newTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      TypeBuilder::Entry::operator=((Entry *)auStack_2e8,(Array *)local_88);
      break;
    case 4:
      uVar19 = 0x137;
      pcVar15 = "TODO: cont";
      goto LAB_00191ee8;
    default:
      uVar19 = 0x13b;
      pcVar15 = "unexpected type kind";
LAB_00191ee8:
      wasm::handle_unreachable
                (pcVar15,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp"
                 ,uVar19);
    }
    local_c8 = local_c8 + 1;
  } while( true );
}

Assistant:

void Fuzzer::checkCanonicalization() {
  // Check that structural canonicalization is working correctly by building the
  // types again, choosing randomly between equivalent possible children for
  // each definition from both the new and old sets of built types.
  TypeBuilder builder(types.size());

  // Helper for creating new definitions of existing types, randomly choosing
  // between canonical and temporary components.
  struct Copier {
    Random& rand;
    const std::vector<HeapType>& types;
    TypeBuilder& builder;

    // For each type, the indices in `types` at which it appears.
    std::unordered_map<HeapType, std::vector<Index>> typeIndices;

    // For each type, the index one past the end of its rec group, or
    // alternatively the cumulative size of its rec group and previous rec
    // groups.
    std::vector<Index> recGroupEnds;

    // The index of the type we are currently building.
    Index index = 0;

    Copier(Fuzzer& parent, TypeBuilder& builder)
      : rand(parent.rand), types(parent.types), builder(builder) {
      // Set the type indices
      for (size_t i = 0; i < types.size(); ++i) {
        typeIndices[types[i]].push_back(i);
      }

      // Set supertypes
      // TODO: support setting old canonical types as the supertypes.
      const auto& subtypeIndices = parent.subtypeIndices;
      for (size_t super = 0; super < subtypeIndices.size(); ++super) {
        for (auto sub : subtypeIndices[super]) {
          if (sub != super) {
            builder[sub].subTypeOf(builder[super]);
          }
        }
      }

      // Set finality and shareability
      for (size_t i = 0; i < types.size(); ++i) {
        builder[i].setOpen(types[i].isOpen());
        builder[i].setShared(types[i].getShared());
      }

      // Set up recursion groups and record group ends to ensure we only select
      // valid children.
      recGroupEnds.reserve(builder.size());
      // Set up recursion groups
      std::optional<RecGroup> currGroup;
      size_t currGroupStart = 0;
      auto finishGroup = [&](Index end) {
        builder.createRecGroup(currGroupStart, end - currGroupStart);
        for (Index i = currGroupStart; i < end; ++i) {
          recGroupEnds.push_back(end);
        }
        currGroupStart = end;
      };
      for (Index i = 0; i < types.size(); ++i) {
        auto newGroup = types[i].getRecGroup();
        if (!currGroup || newGroup != currGroup ||
            types[i] == types[currGroupStart]) {
          finishGroup(i);
          currGroup = newGroup;
        }
      }
      finishGroup(builder.size());

      // Copy the original types
      for (; index < types.size(); ++index) {
        auto type = types[index];
        switch (type.getKind()) {
          case HeapTypeKind::Func:
            builder[index] = getSignature(type.getSignature());
            continue;
          case HeapTypeKind::Struct:
            builder[index] = getStruct(type.getStruct());
            continue;
          case HeapTypeKind::Array:
            builder[index] = getArray(type.getArray());
            continue;
          case HeapTypeKind::Cont:
            WASM_UNREACHABLE("TODO: cont");
          case HeapTypeKind::Basic:
            break;
        }
        WASM_UNREACHABLE("unexpected type kind");
      }
    }

    struct NewHeapType : HeapType {};
    struct OldHeapType : HeapType {};
    struct CopiedHeapType {
      std::variant<NewHeapType, OldHeapType> type;
      NewHeapType* getNew() { return std::get_if<NewHeapType>(&type); }
      OldHeapType* getOld() { return std::get_if<OldHeapType>(&type); }
      HeapType get() {
        return getNew() ? HeapType(*getNew()) : HeapType(*getOld());
      }
    };

    struct NewType : Type {};
    struct OldType : Type {};
    struct CopiedType {
      std::variant<NewType, OldType> type;
      NewType* getNew() { return std::get_if<NewType>(&type); }
      OldType* getOld() { return std::get_if<OldType>(&type); }
      Type get() { return getNew() ? Type(*getNew()) : Type(*getOld()); }
    };

    CopiedHeapType getChildHeapType(HeapType old) {
      auto it = typeIndices.find(old);
      if (it == typeIndices.end()) {
        // This is a basic heap type and wasn't explicitly built.
        assert(old.isBasic());
        return {OldHeapType{old}};
      }
      assert(!old.isBasic());
      // Check whether this child heap type is supposed to be a self-reference
      // into the recursion group we are defining. If it is, we must use the
      // corresponding type in the new recursion group, since anything else
      // would break isorecursive equivalence.
      auto group = old.getRecGroup();
      if (group == types[index].getRecGroup()) {
        // This is a self-reference, so find the correct index, which is the
        // last matching index less than the end of this rec group.
        std::optional<Index> i;
        for (auto candidate : it->second) {
          if (candidate >= recGroupEnds[index]) {
            break;
          }
          i = candidate;
        }
        return {NewHeapType{builder[*i]}};
      }
      // Choose whether to use an old type or a new type
      if (rand.oneIn(2)) {
        // Using a copied heap type; filter out invalid candidates.
        // Filter out invalid candidates.
        std::vector<Index> candidateIndices;
        for (auto i : it->second) {
          if (i < recGroupEnds[index]) {
            candidateIndices.push_back(i);
          }
        }
        assert(!candidateIndices.empty());
        Index i = rand.pick(candidateIndices);
        return {NewHeapType{builder[i]}};
      } else {
        // Using an original heap type.
        Index i = rand.pick(it->second);
        return {OldHeapType{types[i]}};
      }
    }

    CopiedType getTuple(Type old) {
      TypeList types;
      types.reserve(old.size());
      bool hasTempChild = false;
      for (auto type : old) {
        auto copied = getType(type);
        if (copied.getNew()) {
          hasTempChild = true;
        }
        types.push_back(copied.get());
      }
      // Must use a temporary type if we have a temporary child, otherwise we
      // can choose.
      if (hasTempChild || rand.oneIn(2)) {
        return {NewType{builder.getTempTupleType(types)}};
      } else {
        return {OldType{Tuple(std::move(types))}};
      }
    }

    CopiedType getRef(Type old) {
      auto copied = getChildHeapType(old.getHeapType());
      auto type = copied.get();
      auto nullability = old.getNullability();
      if (copied.getNew()) {
        // The child is temporary, so we must put it in a temporary type.
        return {NewType{builder.getTempRefType(type, nullability)}};
      } else {
        // The child is canonical, so we can either put it in a temporary type
        // or use the canonical type.
        if (rand.oneIn(2)) {
          return {NewType{builder.getTempRefType(type, nullability)}};
        } else {
          return {OldType{Type(type, nullability)}};
        }
      }
    }

    CopiedType getType(Type old) {
      if (old.isTuple()) {
        return getTuple(old);
      } else if (old.isRef()) {
        return getRef(old);
      } else {
        assert(old.isBasic());
        return {OldType{old}};
      }
    }

    Field getField(Field old) {
      old.type = getType(old.type).get();
      return old;
    }

    Signature getSignature(Signature old) {
      return {getType(old.params).get(), getType(old.results).get()};
    }

    Struct getStruct(const Struct& old) {
      FieldList fields;
      fields.reserve(old.fields.size());
      for (const auto& field : old.fields) {
        fields.push_back(getField(field));
      }
      return {std::move(fields)};
    }

    Array getArray(Array old) {
      old.element = getField(old.element);
      return old;
    }
  };

  Copier{*this, builder};

  auto result = builder.build();
  if (auto* error = result.getError()) {
    IndexedTypeNameGenerator print(types);
    Fatal() << "Failed to build copies of the types: " << error->reason
            << " at index " << error->index;
  }
  auto newTypes = *result;
  assert(types.size() == newTypes.size());
  for (size_t i = 0; i < types.size(); ++i) {
    if (types[i] != newTypes[i]) {
      IndexedTypeNameGenerator print(types);
      std::cerr << "\n";
      for (size_t j = 0; j < newTypes.size(); ++j) {
        std::cerr << j << ": " << print(newTypes[j]) << "\n";
      }
      Fatal() << "Copy of type at index " << i << " is distinct:\n"
              << "original: " << print(types[i]) << '\n'
              << "copy:     " << print(newTypes[i]);
    }
  }
}